

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O1

void Amap_LibertyWipeOutComments(char *pBeg,char *pEnd)

{
  long lVar1;
  char *pCur;
  char *pcVar2;
  long lVar3;
  
  if (pBeg < pEnd) {
    do {
      pcVar2 = pBeg;
      if ((*pBeg == '/') && (pBeg < pEnd && pBeg[1] == '*')) {
        lVar3 = 1;
        lVar1 = 0;
        do {
          if ((pBeg[lVar3 + -1] == '*') && (pBeg[lVar3] == '/')) {
            pcVar2 = pBeg + -lVar1;
            if (pBeg < pBeg + (2 - lVar1)) {
              lVar3 = -2;
              do {
                if (pBeg[lVar3 + 2] != '\n') {
                  pBeg[lVar3 + 2] = ' ';
                }
                lVar3 = lVar3 + 1;
              } while (lVar1 + lVar3 != 0);
            }
            break;
          }
          lVar1 = lVar1 + -1;
          lVar3 = lVar3 + 1;
          pcVar2 = pEnd;
        } while ((long)pBeg - (long)pEnd != lVar1);
      }
      pBeg = pcVar2 + 1;
    } while (pBeg < pEnd);
  }
  return;
}

Assistant:

void Amap_LibertyWipeOutComments( char * pBeg, char * pEnd )
{
    char * pCur, * pStart;
    for ( pCur = pBeg; pCur < pEnd; pCur++ )
    if ( pCur[0] == '/' && pCur[1] == '*' )
        for ( pStart = pCur; pCur < pEnd; pCur++ )
        if ( pCur[0] == '*' && pCur[1] == '/' )
        {
            for ( ; pStart < pCur + 2; pStart++ )
            if ( *pStart != '\n' ) *pStart = ' ';
            break;
        }
}